

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O0

bool google::protobuf::util::MessageDifferencer::CheckPathChanged
               (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                *field_path)

{
  bool bVar1;
  reference pSVar2;
  SpecificField *specific_field;
  const_iterator __end2;
  const_iterator __begin2;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *__range2;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *field_path_local;
  
  __end2 = std::
           vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
           ::begin(field_path);
  specific_field =
       (SpecificField *)
       std::
       vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
       ::end(field_path);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_google::protobuf::util::MessageDifferencer::SpecificField_*,_std::vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>_>
                                *)&specific_field);
    if (!bVar1) {
      return false;
    }
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_google::protobuf::util::MessageDifferencer::SpecificField_*,_std::vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>_>
             ::operator*(&__end2);
    if (((pSVar2->field == (FieldDescriptor *)0x0) ||
        (bVar1 = FieldDescriptor::is_map(pSVar2->field), !bVar1)) &&
       (pSVar2->index != pSVar2->new_index)) break;
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::util::MessageDifferencer::SpecificField_*,_std::vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>_>
    ::operator++(&__end2);
  }
  return true;
}

Assistant:

bool MessageDifferencer::CheckPathChanged(
    const std::vector<SpecificField>& field_path) {
  for (const SpecificField& specific_field : field_path) {
    // Don't check indexes for map entries -- maps are unordered.
    if (specific_field.field != nullptr && specific_field.field->is_map())
      continue;
    if (specific_field.index != specific_field.new_index) return true;
  }
  return false;
}